

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,OpenMode modes)

{
  long lVar1;
  iterator iVar2;
  iterator iVar3;
  storage_type *in_RCX;
  ulong uVar4;
  uint in_EDX;
  undefined4 in_register_00000034;
  QDebug *this;
  Stream *pSVar5;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QByteArrayView ba_03;
  QByteArrayView ba_04;
  QByteArrayView ba_05;
  QByteArrayView ba_06;
  QString local_88;
  QArrayDataPointer<QString> local_68;
  QString local_48;
  long local_30;
  
  this = (QDebug *)
         CONCAT44(in_register_00000034,
                  modes.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar5 = this->stream;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"OpenMode(";
  QString::fromUtf8(&local_48,(QString *)0x9,ba);
  QTextStream::operator<<(&pSVar5->ts,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (this->stream->space == true) {
    QTextStream::operator<<(&this->stream->ts,' ');
  }
  local_68.d = (Data *)0x0;
  local_68.ptr = (QString *)0x0;
  local_68.size = 0;
  if (in_EDX == 0) {
    ba_06.m_data = in_RCX;
    ba_06.m_size = (qsizetype)"NotOpen";
    QString::fromLatin1(&local_48,(QString *)&DAT_00000007,ba_06);
    local_88.d.d = local_48.d.d;
    local_88.d.ptr = local_48.d.ptr;
    local_88.d.size = local_48.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
    QList<QString>::end((QList<QString> *)&local_68);
  }
  else {
    if ((in_EDX & 1) != 0) {
      ba_00.m_data = in_RCX;
      ba_00.m_size = (qsizetype)"ReadOnly";
      QString::fromLatin1(&local_48,(QString *)0x8,ba_00);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX & 2) != 0) {
      ba_01.m_data = in_RCX;
      ba_01.m_size = (qsizetype)"WriteOnly";
      QString::fromLatin1(&local_48,(QString *)0x9,ba_01);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX & 4) != 0) {
      ba_02.m_data = in_RCX;
      ba_02.m_size = (qsizetype)"Append";
      QString::fromLatin1(&local_48,(QString *)0x6,ba_02);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX & 8) != 0) {
      ba_03.m_data = in_RCX;
      ba_03.m_size = (qsizetype)"Truncate";
      QString::fromLatin1(&local_48,(QString *)0x8,ba_03);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX & 0x10) != 0) {
      ba_04.m_data = in_RCX;
      ba_04.m_size = (qsizetype)"Text";
      QString::fromLatin1(&local_48,(QString *)0x4,ba_04);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX & 0x20) == 0) goto LAB_002453fe;
    ba_05.m_data = in_RCX;
    ba_05.m_size = (qsizetype)"Unbuffered";
    QString::fromLatin1(&local_48,(QString *)0xa,ba_05);
    local_88.d.d = local_48.d.d;
    local_88.d.ptr = local_48.d.ptr;
    local_88.d.size = local_48.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
    QList<QString>::end((QList<QString> *)&local_68);
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_002453fe:
  iVar2 = QList<QString>::begin((QList<QString> *)&local_68);
  iVar3 = QList<QString>::end((QList<QString> *)&local_68);
  if (iVar2.i != iVar3.i) {
    uVar4 = ((long)iVar3.i - (long)iVar2.i >> 3) * -0x5555555555555555;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::__introsort_loop<QList<QString>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar2.i,iVar3.i,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<QString>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar2.i,iVar3.i);
  }
  local_88.d.d = (Data *)CONCAT62(local_88.d.d._2_6_,0x7c);
  QtPrivate::QStringList_join(&local_48,(QStringList *)&local_68,(QChar *)&local_88,1);
  if ((QChar *)local_48.d.ptr == (QChar *)0x0) {
    local_48.d.ptr = &QString::_empty;
  }
  QDebug::putString(this,(QChar *)local_48.d.ptr,local_48.d.size);
  if (this->stream->space == true) {
    QTextStream::operator<<(&this->stream->ts,' ');
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  QTextStream::operator<<(&this->stream->ts,')');
  pSVar5 = this->stream;
  if (pSVar5->space == true) {
    QTextStream::operator<<(&pSVar5->ts,' ');
    pSVar5 = this->stream;
  }
  this->stream = (Stream *)0x0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar5;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QIODevice::OpenMode modes)
{
    debug << "OpenMode(";
    QStringList modeList;
    if (modes == QIODevice::NotOpen) {
        modeList << "NotOpen"_L1;
    } else {
        if (modes & QIODevice::ReadOnly)
            modeList << "ReadOnly"_L1;
        if (modes & QIODevice::WriteOnly)
            modeList << "WriteOnly"_L1;
        if (modes & QIODevice::Append)
            modeList << "Append"_L1;
        if (modes & QIODevice::Truncate)
            modeList << "Truncate"_L1;
        if (modes & QIODevice::Text)
            modeList << "Text"_L1;
        if (modes & QIODevice::Unbuffered)
            modeList << "Unbuffered"_L1;
    }
    std::sort(modeList.begin(), modeList.end());
    debug << modeList.join(u'|');
    debug << ')';
    return debug;
}